

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::GenerateSeriesFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  initializer_list<duckdb::LogicalType> iVar3;
  initializer_list<duckdb::LogicalType> iVar4;
  bool bVar5;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ScalarFunction,_true> *__range1;
  ScalarFunctionSet *generate_series;
  allocator_type *in_stack_fffffffffffff5b8;
  ScalarFunction *pSVar6;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff5c0;
  ScalarFunction *pSVar7;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffff5c8;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *p_Var8;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff5d4;
  LogicalTypeId in_stack_fffffffffffff5df;
  LogicalType *in_stack_fffffffffffff5e0;
  LogicalType *pLVar10;
  ScalarFunctionSet *in_stack_fffffffffffff600;
  LogicalType *in_stack_fffffffffffff608;
  undefined8 **local_960;
  undefined8 **local_940;
  bind_scalar_function_extended_t in_stack_fffffffffffff6e0;
  undefined1 ***bind_extended;
  bind_scalar_function_t in_stack_fffffffffffff6e8;
  bind_scalar_function_t bind;
  scalar_function_t *in_stack_fffffffffffff6f0;
  scalar_function_t *function;
  LogicalType *in_stack_fffffffffffff6f8;
  scalar_function_t *return_type;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff700;
  scalar_function_t *arguments;
  ScalarFunction *this;
  function_statistics_t in_stack_fffffffffffff740;
  init_local_state_t in_stack_fffffffffffff748;
  LogicalType *in_stack_fffffffffffff750;
  FunctionStability in_stack_fffffffffffff758;
  FunctionNullHandling in_stack_fffffffffffff760;
  bind_lambda_function_t in_stack_fffffffffffff768;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_820;
  vector<duckdb::ScalarFunction,_true> *local_818;
  undefined1 **local_7a0;
  undefined8 *local_798 [3];
  undefined1 local_780 [24];
  undefined1 local_768 [24];
  undefined1 **local_750;
  undefined8 local_748;
  undefined1 local_600 [112];
  undefined1 **local_590;
  undefined8 *local_588 [3];
  undefined1 local_570 [24];
  undefined1 local_558 [24];
  undefined1 **local_540;
  undefined8 local_538;
  undefined1 local_3f0 [111];
  undefined1 local_381;
  undefined1 **local_380;
  undefined1 *local_378 [3];
  undefined1 local_360 [24];
  undefined1 **local_348;
  undefined8 local_340;
  undefined1 local_1f8 [107];
  undefined1 local_18d [21];
  undefined1 local_178 [24];
  scalar_function_t local_160 [10];
  undefined1 local_9;
  
  local_9 = 0;
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffff600);
  local_18d._13_8_ = local_178;
  LogicalType::LogicalType(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5df);
  local_160[0].super__Function_base._M_functor._0_8_ = local_178;
  local_160[0].super__Function_base._M_functor._8_8_ = 1;
  this = (ScalarFunction *)local_18d;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x201dc5c);
  iVar1._M_len._0_4_ = in_stack_fffffffffffff5d0;
  iVar1._M_array = (iterator)in_stack_fffffffffffff5c8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff5d4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffff5c0,iVar1,in_stack_fffffffffffff5b8);
  LogicalType::LogicalType(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5df);
  LogicalType::LIST(in_stack_fffffffffffff608);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),in_stack_fffffffffffff5c8
            );
  LogicalType::LogicalType(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5df);
  p_Var8 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_1f8;
  pLVar10 = (LogicalType *)0x0;
  uVar9 = 0;
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this,in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,in_stack_fffffffffffff740,
             in_stack_fffffffffffff748,in_stack_fffffffffffff750,in_stack_fffffffffffff758,
             in_stack_fffffffffffff760,in_stack_fffffffffffff768);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  LogicalType::~LogicalType((LogicalType *)0x201dd67);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x201dd74);
  LogicalType::~LogicalType((LogicalType *)0x201dd81);
  LogicalType::~LogicalType((LogicalType *)0x201dd8e);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x201dd9b);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x201dda8);
  return_type = (scalar_function_t *)local_178;
  function = local_160;
  do {
    function = (scalar_function_t *)((long)&function[-1].super__Function_base._M_functor + 8);
    LogicalType::~LogicalType((LogicalType *)0x201dddd);
  } while (function != return_type);
  local_380 = local_378;
  arguments = function;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_380 = (undefined1 **)local_360;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_348 = local_378;
  local_340 = 2;
  bind = (bind_scalar_function_t)&local_381;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x201de63);
  iVar2._M_len._0_4_ = uVar9;
  iVar2._M_array = (iterator)p_Var8;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff5d4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar7,iVar2,(allocator_type *)pSVar6);
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  LogicalType::LIST(in_stack_fffffffffffff608);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff5d4,uVar9),p_Var8);
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  p_Var8 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_3f0;
  pLVar10 = (LogicalType *)0x0;
  uVar9 = 0;
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this,(vector<duckdb::LogicalType,_true> *)arguments,(LogicalType *)return_type,function
             ,bind,in_stack_fffffffffffff6e0,in_stack_fffffffffffff740,in_stack_fffffffffffff748,
             in_stack_fffffffffffff750,in_stack_fffffffffffff758,in_stack_fffffffffffff760,
             in_stack_fffffffffffff768);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  LogicalType::~LogicalType((LogicalType *)0x201df6e);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x201df7b);
  LogicalType::~LogicalType((LogicalType *)0x201df88);
  LogicalType::~LogicalType((LogicalType *)0x201df95);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x201dfa2);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x201dfaf);
  bind_extended = &local_348;
  do {
    bind_extended = bind_extended + -3;
    LogicalType::~LogicalType((LogicalType *)0x201dfe4);
  } while (bind_extended != (undefined1 ***)local_378);
  local_590 = (undefined1 **)local_588;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_590 = (undefined1 **)local_570;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_590 = (undefined1 **)local_558;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_540 = (undefined1 **)local_588;
  local_538 = 3;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x201e086);
  iVar3._M_len._0_4_ = uVar9;
  iVar3._M_array = (iterator)p_Var8;
  iVar3._M_len._4_4_ = in_stack_fffffffffffff5d4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar7,iVar3,(allocator_type *)pSVar6);
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  LogicalType::LIST(in_stack_fffffffffffff608);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff5d4,uVar9),p_Var8);
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  p_Var8 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_600;
  pLVar10 = (LogicalType *)0x0;
  uVar9 = 0;
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this,(vector<duckdb::LogicalType,_true> *)arguments,(LogicalType *)return_type,function
             ,bind,(bind_scalar_function_extended_t)bind_extended,in_stack_fffffffffffff740,
             in_stack_fffffffffffff748,in_stack_fffffffffffff750,in_stack_fffffffffffff758,
             in_stack_fffffffffffff760,in_stack_fffffffffffff768);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  LogicalType::~LogicalType((LogicalType *)0x201e191);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x201e19e);
  LogicalType::~LogicalType((LogicalType *)0x201e1ab);
  LogicalType::~LogicalType((LogicalType *)0x201e1b8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x201e1c5);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x201e1d2);
  local_940 = &local_540;
  do {
    local_940 = local_940 + -3;
    LogicalType::~LogicalType((LogicalType *)0x201e207);
  } while (local_940 != local_588);
  local_7a0 = (undefined1 **)local_798;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_7a0 = (undefined1 **)local_780;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_7a0 = (undefined1 **)local_768;
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  local_750 = (undefined1 **)local_798;
  local_748 = 3;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x201e2a9);
  iVar4._M_len._0_4_ = uVar9;
  iVar4._M_array = (iterator)p_Var8;
  iVar4._M_len._4_4_ = in_stack_fffffffffffff5d4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar7,iVar4,(allocator_type *)pSVar6);
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  LogicalType::LIST(in_stack_fffffffffffff608);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff5d4,uVar9),p_Var8);
  LogicalType::LogicalType(pLVar10,in_stack_fffffffffffff5df);
  pSVar7 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this,(vector<duckdb::LogicalType,_true> *)arguments,(LogicalType *)return_type,function
             ,bind,(bind_scalar_function_extended_t)bind_extended,in_stack_fffffffffffff740,
             in_stack_fffffffffffff748,in_stack_fffffffffffff750,in_stack_fffffffffffff758,
             in_stack_fffffffffffff760,in_stack_fffffffffffff768);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar7,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar7);
  LogicalType::~LogicalType((LogicalType *)0x201e3b4);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x201e3c1);
  LogicalType::~LogicalType((LogicalType *)0x201e3ce);
  LogicalType::~LogicalType((LogicalType *)0x201e3db);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x201e3e8);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x201e3f5);
  local_960 = &local_750;
  do {
    local_960 = local_960 + -3;
    LogicalType::~LogicalType((LogicalType *)0x201e42a);
  } while (local_960 != local_798);
  local_818 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  local_820._M_current =
       (ScalarFunction *)
       ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin(pSVar6)
  ;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)pSVar6);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)pSVar7,
                            (__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)pSVar6), bVar5) {
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator*(&local_820);
    BaseScalarFunction::SetReturnsError(&pSVar6->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&pSVar7->super_BaseScalarFunction);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_820);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet GenerateSeriesFun::GetFunctions() {
	ScalarFunctionSet generate_series;
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT},
	                                           LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT},
	                                           LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                           LogicalType::LIST(LogicalType::TIMESTAMP),
	                                           ListRangeFunction<TimestampRangeInfo, true>));
	for (auto &func : generate_series.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return generate_series;
}